

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ReaderMgr::getLastExtEntityInfo(ReaderMgr *this,LastExtEntityInfo *lastInfo)

{
  XMLReader *pXVar1;
  XMLCh *pXVar2;
  XMLCh *pXVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  XMLEntityDecl *theEntity;
  XMLEntityDecl *local_10;
  
  auVar4 = (undefined1  [16])0x0;
  pXVar2 = L"";
  if (this->fReaderStack == (RefStackOf<xercesc_4_0::ReaderMgr::ReaderData> *)0x0) {
    pXVar3 = L"";
  }
  else {
    pXVar3 = L"";
    if (this->fCurReader != (XMLReader *)0x0) {
      pXVar1 = getLastExtEntity(this,&local_10);
      pXVar2 = pXVar1->fSystemId;
      pXVar3 = pXVar1->fPublicId;
      auVar4._0_8_ = pXVar1->fCurCol;
      auVar4._8_8_ = pXVar1->fCurLine;
    }
  }
  lastInfo->systemId = pXVar2;
  lastInfo->publicId = pXVar3;
  auVar5._0_8_ = auVar4._8_8_;
  auVar5._8_4_ = auVar4._0_4_;
  auVar5._12_4_ = auVar4._4_4_;
  lastInfo->lineNumber = auVar5._0_8_;
  lastInfo->colNumber = auVar5._8_8_;
  return;
}

Assistant:

void ReaderMgr::getLastExtEntityInfo(LastExtEntityInfo& lastInfo) const
{
    //
    //  If the reader stack never got created or we've not managed to open any
    //  main entity yet, then we can't give this information.
    //
    if (!fReaderStack || !fCurReader)
    {
        lastInfo.systemId = XMLUni::fgZeroLenString;
        lastInfo.publicId = XMLUni::fgZeroLenString;
        lastInfo.lineNumber = 0;
        lastInfo.colNumber = 0;
        return;
    }

    // We have at least one entity so get the data
    const XMLEntityDecl*    theEntity;
    const XMLReader*        theReader = getLastExtEntity(theEntity);

    // Fill in the info structure with the reader we found
    lastInfo.systemId = theReader->getSystemId();
    lastInfo.publicId = theReader->getPublicId();
    lastInfo.lineNumber = theReader->getLineNumber();
    lastInfo.colNumber = theReader->getColumnNumber();
}